

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall L12_1::String::String(String *this)

{
  char *pcVar1;
  ulong uVar2;
  String *this_local;
  
  this->_length = 0;
  uVar2 = (ulong)(this->_length + 1);
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->_p_str = pcVar1;
  *this->_p_str = '\0';
  std::operator<<((ostream *)&std::cout,"init as default...");
  num_strings = num_strings + 1;
  return;
}

Assistant:

String::String() {
        //  空字符串是 '\0'
        _length = 0;
        _p_str = new char[_length + 1];
        _p_str[0] = '\0';

        std::cout << "init as default...";
        num_strings++;
    }